

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

string * __thiscall
soul::heart::IODeclaration::getTypesDescription_abi_cxx11_
          (string *__return_storage_ptr__,IODeclaration *this)

{
  Type *this_00;
  long lVar1;
  ulong uVar2;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,", ","");
  this_00 = (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (this_00 ==
      (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    Type::getDescription_abi_cxx11_(__return_storage_ptr__,this_00);
    if (1 < (ulong)(((long)(this->dataTypes).
                           super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(this->dataTypes).
                           super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
      uVar2 = 1;
      lVar1 = 0x18;
      do {
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70[0]);
        Type::getDescription_abi_cxx11_
                  (&local_50,
                   (Type *)(&((this->dataTypes).
                              super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
                              super__Vector_impl_data._M_start)->category + lVar1));
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 0x18;
      } while (uVar2 < (ulong)(((long)(this->dataTypes).
                                      super__Vector_base<soul::Type,_std::allocator<soul::Type>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->dataTypes).
                                      super__Vector_base<soul::Type,_std::allocator<soul::Type>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 3) *
                              -0x5555555555555555));
    }
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getTypesDescription() const
        {
            return joinStrings (dataTypes, ", ", [] (auto& t) { return t.getDescription(); });
        }